

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O1

void __thiscall
SplitStringTest_random_long_prefix_delim_Test<char32_t>::TestBody
          (SplitStringTest_random_long_prefix_delim_Test<char32_t> *this)

{
  vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  *this_00;
  pointer *__ptr;
  char *pcVar1;
  AssertionResult gtest_ar;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> delim;
  vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  split_result;
  RandomTestData<char32_t,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  data;
  long *local_f8;
  AssertHelper local_f0 [8];
  internal local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_d8;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_b8;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_98;
  RandomTestData<char32_t,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  local_78;
  
  make_delim_long<char32_t,std::__cxx11::u32string>(&local_d8,8,L'\0');
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::u32string::_M_construct<char32_t*>
            ((u32string *)&local_b8,local_d8._M_dataplus._M_p,
             local_d8._M_dataplus._M_p + local_d8._M_string_length);
  RandomTestData<char32_t,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  ::RandomTestData(&local_78,&local_b8,0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity * 4 + 4);
  }
  std::operator+(&local_98,&local_d8,&local_78.m_str);
  TestBody();
  this_00 = &local_78.m_tokens;
  std::
  vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::_M_emplace_aux<>(this_00,(const_iterator)
                             local_78.m_tokens.
                             super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  jessilib::
  split<std::vector,___gnu_cxx::__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,___gnu_cxx::__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,___gnu_cxx::__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,___gnu_cxx::__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
            ((container_type *)&local_98,
             (__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
              )local_78.m_str._M_dataplus._M_p,
             (__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
              )(local_78.m_str._M_dataplus._M_p + local_78.m_str._M_string_length),
             (__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
              )local_d8._M_dataplus._M_p,
             (__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
              )(local_d8._M_dataplus._M_p + local_d8._M_string_length));
  testing::internal::
  CmpHelperEQ<std::vector<std::__cxx11::u32string,std::allocator<std::__cxx11::u32string>>,std::vector<std::__cxx11::u32string,std::allocator<std::__cxx11::u32string>>>
            (local_e8,"split_result","data.m_tokens",
             (vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)&local_98,this_00);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0x101,pcVar1);
    testing::internal::AssertHelper::operator=(local_f0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_f0);
    if (local_f8 != (long *)0x0) {
      (**(code **)(*local_f8 + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  std::
  vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
             *)&local_98);
  std::
  vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::~vector(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_78.m_str._M_dataplus._M_p != &local_78.m_str.field_2) {
    operator_delete(local_78.m_str._M_dataplus._M_p,
                    local_78.m_str.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_78.m_delim._M_dataplus._M_p != &local_78.m_delim.field_2) {
    operator_delete(local_78.m_delim._M_dataplus._M_p,
                    local_78.m_delim.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity * 4 + 4);
  }
  return;
}

Assistant:

TYPED_TEST(SplitStringTest, random_long_prefix_delim) {
	auto delim = make_delim_long<TypeParam>(8);
	RandomTestData<TypeParam> data{ delim };
	data.m_str = delim + data.m_str;
	data.m_tokens.emplace(data.m_tokens.begin());
	std::vector<std::basic_string<TypeParam>> split_result = split(data.m_str, delim);
	EXPECT_EQ(split_result, data.m_tokens);
}